

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeTextUtil.cc
# Opt level: O1

void __thiscall
encodeTextUtil::encodeTextUtil(encodeTextUtil *this,int *lockParameters,char **names,int lockIndex)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  map<char,_duplicateKeys_*,_std::less<char>,_std::allocator<std::pair<const_char,_duplicateKeys_*>_>_>
  *this_00;
  int iVar3;
  uint uVar4;
  _Self __tmp;
  lock *this_01;
  _Base_ptr p_Var5;
  mapped_type *ppdVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  duplicateKeys *pdVar9;
  _Base_ptr p_Var10;
  bool bVar11;
  uint rand_seed;
  char *key;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> duplicates;
  timespec seedTime;
  char local_92;
  char local_91;
  map<char,_duplicateKeys_*,_std::less<char>,_std::allocator<std::pair<const_char,_duplicateKeys_*>_>_>
  *local_90;
  _Base_ptr local_88;
  uint local_7c;
  char *local_78;
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  local_70;
  timespec local_40;
  
  local_90 = &this->characterToKeyObject;
  p_Var1 = &(this->characterToKeyObject)._M_t._M_impl.super__Rb_tree_header;
  (this->characterToKeyObject)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->characterToKeyObject)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->characterToKeyObject)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->characterToKeyObject)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->characterToKeyObject)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->characterToKeyObjectIterator)._M_node = (_Base_ptr)0x0;
  this_01 = (lock *)operator_new(0x40);
  local_88 = &p_Var1->_M_header;
  lock::lock(this_01,lockParameters + lockIndex * 3,names[lockIndex]);
  this->lockObject = this_01;
  local_7c = 0x7ab8;
  clock_gettime(1,&local_40);
  local_7c = (uint)local_40.tv_nsec;
  local_70._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_70._M_impl.super__Rb_tree_header._M_header;
  local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
  bVar11 = false;
  local_70._M_impl.super__Rb_tree_header._M_header._M_right =
       local_70._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    iVar3 = rand_r(&local_7c);
    (this->overlay).seed = iVar3;
    lock::check(this->lockObject,(char *)this,4);
    uVar4 = lock::getARealKey(this->lockObject,&local_78);
    if ((int)uVar4 < 7) {
      fprintf(_stderr,"Shouldn\'t have gotten a key this small: %d",(ulong)uVar4);
    }
    else {
      cVar2 = local_78[(ulong)uVar4 - 1];
      p_Var5 = local_88;
      for (p_Var8 = (this->characterToKeyObject)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_parent; (_Rb_tree_header *)p_Var8 != (_Rb_tree_header *)0x0;
          p_Var8 = (&p_Var8->_M_left)[(char)*(size_t *)(p_Var8 + 1) < cVar2]) {
        if (cVar2 <= (char)*(size_t *)(p_Var8 + 1)) {
          p_Var5 = p_Var8;
        }
      }
      p_Var10 = local_88;
      if ((p_Var5 != local_88) && (p_Var10 = p_Var5, cVar2 < (char)p_Var5[1]._M_color)) {
        p_Var10 = local_88;
      }
      (this->characterToKeyObjectIterator)._M_node = p_Var10;
      if (p_Var10 == local_88) {
        pdVar9 = (duplicateKeys *)operator_new(0x10);
        duplicateKeys::duplicateKeys(pdVar9);
        this_00 = local_90;
        local_92 = cVar2;
        ppdVar6 = std::
                  map<char,_duplicateKeys_*,_std::less<char>,_std::allocator<std::pair<const_char,_duplicateKeys_*>_>_>
                  ::operator[](local_90,&local_92);
        *ppdVar6 = pdVar9;
        local_92 = cVar2;
        ppdVar6 = std::
                  map<char,_duplicateKeys_*,_std::less<char>,_std::allocator<std::pair<const_char,_duplicateKeys_*>_>_>
                  ::operator[](this_00,&local_92);
        pdVar9 = *ppdVar6;
        iVar3 = lock::seedOf(this->lockObject);
        iVar3 = duplicateKeys::insert(pdVar9,iVar3);
        local_91 = cVar2;
        pmVar7 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                 ::operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                               *)&local_70,&local_91);
        *pmVar7 = iVar3;
      }
      else {
        local_92 = cVar2;
        ppdVar6 = std::
                  map<char,_duplicateKeys_*,_std::less<char>,_std::allocator<std::pair<const_char,_duplicateKeys_*>_>_>
                  ::operator[](local_90,&local_92);
        pdVar9 = *ppdVar6;
        iVar3 = lock::seedOf(this->lockObject);
        iVar3 = duplicateKeys::insert(pdVar9,iVar3);
        local_91 = cVar2;
        pmVar7 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                 ::operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                               *)&local_70,&local_91);
        *pmVar7 = iVar3;
        if (0xff < local_70._M_impl.super__Rb_tree_header._M_node_count) {
          bVar11 = true;
          for (p_Var8 = local_70._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var8 != &local_70._M_impl.super__Rb_tree_header;
              p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
            bVar11 = (bool)(bVar11 & 3 < *(int *)&p_Var8[1].field_0x4);
          }
        }
      }
    }
  } while (!bVar11);
  std::
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  ::~_Rb_tree(&local_70);
  return;
}

Assistant:

encodeTextUtil::encodeTextUtil(int * lockParameters, const char ** names, int lockIndex) {
  char * key;
  lockObject = new lock(lockParameters+3*lockIndex, *(names+lockIndex));
  int size;
  bool done = false;
  unsigned int rand_seed = 31416;
  struct timespec seedTime;
  clock_gettime(CLOCK_MONOTONIC, &seedTime);
  rand_seed = seedTime.tv_nsec & 0xffffffff;

  std::map<char, int>  duplicates;
  do {
    overlay.seed = rand_r(&rand_seed);
    lockObject->check(overlay.bytes, 4);
    size = lockObject->getARealKey(&key);
    if (size > 6) {
      int c = key[size - 1];
      characterToKeyObjectIterator = characterToKeyObject.find(c);
      if (characterToKeyObjectIterator != characterToKeyObject.end()) {
        duplicates[c] = characterToKeyObject[c]->insert(lockObject->seedOf());
        if (duplicates.size() >= 256) {
          done = true;
          for (std::map<char, int>::iterator it = duplicates.begin(); it != duplicates.end(); it++) {
            done &= (it->second > 3);
          }
        }
      } else {
        characterToKeyObject[c] = new duplicateKeys();
        duplicates[c] = characterToKeyObject[c]->insert(lockObject->seedOf());
      }
    } else {
      fprintf(stderr, "Shouldn't have gotten a key this small: %d", size);
    }
  } while (!done);
}